

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

BuildValue * __thiscall
anon_unknown.dwarf_60e82::PhonyCommand::getResultForOutput
          (BuildValue *__return_storage_ptr__,PhonyCommand *this,Node *node,BuildValue *value)

{
  bool bVar1;
  BuildNode *buildNode;
  BuildValue *value_local;
  Node *node_local;
  PhonyCommand *this_local;
  
  bVar1 = llbuild::buildsystem::BuildNode::isVirtual((BuildNode *)node);
  if ((!bVar1) ||
     (bVar1 = llbuild::buildsystem::BuildNode::isCommandTimestamp((BuildNode *)node), bVar1)) {
    llbuild::buildsystem::ExternalCommand::getResultForOutput
              (__return_storage_ptr__,&this->super_ExternalCommand,node,value);
  }
  else {
    llbuild::buildsystem::BuildValue::makeVirtualInput();
  }
  return __return_storage_ptr__;
}

Assistant:

virtual BuildValue getResultForOutput(Node* node, const BuildValue& value) override {
    // If the node is virtual, the output is always a virtual input value,
    // regardless of the actual build value.
    //
    // This is a special case for phony commands, to avoid them incorrectly
    // propagating failed/cancelled states onwards to downstream commands when
    // they are being used only for ordering purposes.
    auto buildNode = static_cast<BuildNode*>(node);
    if (buildNode->isVirtual() && !buildNode->isCommandTimestamp()) {
      return BuildValue::makeVirtualInput();
    }

    // Otherwise, delegate to the inherited implementation.
    return ExternalCommand::getResultForOutput(node, value);
  }